

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O2

void __thiscall
bal::GraphMLWeightedStreamWriter::write_clauses(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  uint16_t uVar3;
  uint uVar4;
  iterator iVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  double dVar15;
  uint64_t key;
  variable_t local_98;
  variable_t local_94;
  uint *local_90;
  ulong local_88;
  ulong local_80;
  pair<const_unsigned_long,_edge_data_t> local_78;
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  existing_edges;
  
  poVar6 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &existing_edges._M_t._M_impl.super__Rb_tree_header._M_header;
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar14 = (value->clauses_).data_;
  local_90 = puVar14 + (value->clauses_).size_;
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; p_Var7 = existing_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      puVar14 < local_90; puVar14 = puVar14 + (ulong)uVar4 + 1) {
    uVar12 = *puVar14;
    uVar8 = 1;
    uVar10 = 0;
    while( true ) {
      uVar4 = uVar12 & 0xffff;
      if (uVar4 <= uVar10) break;
      if (uVar4 < 2) {
        uVar9 = uVar8;
        uVar11 = uVar10 + 1;
      }
      else {
        uVar13 = 1;
        if (uVar4 < 4) {
          uVar3 = get_cardinality_uint16((uint16_t)(uVar12 >> 0x10));
          uVar13 = (uint)uVar3;
          uVar12 = *puVar14;
          uVar4 = uVar12 & 0xffff;
        }
        dVar15 = ((double)(uVar13 * 2) / (double)uVar4) / (double)(uVar4 - 1);
        local_88 = uVar10 + 1;
        local_80 = uVar8;
        for (; uVar9 = local_80, uVar11 = local_88, uVar8 < (uVar12 & 0xffff); uVar8 = uVar8 + 1) {
          key = CONCAT44((puVar14[uVar8 + 1] >> 1) - 1,(puVar14[uVar10 + 1] >> 1) - 1);
          iVar5 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                  ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                          *)&existing_edges,&key);
          if ((_Rb_tree_header *)iVar5._M_node == &existing_edges._M_t._M_impl.super__Rb_tree_header
             ) {
            local_78.first = key;
            local_78.second.cardinality = uVar13;
            local_78.second.weight = dVar15;
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
            ::
            _M_insert_unique<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
                        *)&existing_edges,&local_78);
          }
          else {
            *(uint *)&iVar5._M_node[1]._M_parent = *(int *)&iVar5._M_node[1]._M_parent + uVar13;
            iVar5._M_node[1]._M_left = (_Base_ptr)((double)iVar5._M_node[1]._M_left + dVar15);
          }
          uVar12 = *puVar14;
        }
      }
      uVar8 = uVar9 + 1;
      uVar10 = uVar11;
    }
  }
  for (; (_Rb_tree_header *)p_Var7 != &existing_edges._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    uVar2 = *(undefined8 *)(p_Var7 + 1);
    p_Var1 = p_Var7[1]._M_left;
    poVar6 = std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                             "<edge source=\"v");
    variable_t::variable_t(&local_94,(variableid_t)uVar2);
    local_78.first = CONCAT44(local_78.first._4_4_,local_94.id * 2 + 3);
    poVar6 = operator<<(poVar6,(literal_t *)&local_78);
    poVar6 = std::operator<<(poVar6,"\" target=\"v");
    variable_t::variable_t(&local_98,(variableid_t)((ulong)uVar2 >> 0x20));
    key = CONCAT44(key._4_4_,local_98.id * 2 + 3);
    poVar6 = operator<<(poVar6,(literal_t *)&key);
    poVar6 = std::operator<<(poVar6,"\">");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                             "<data key=\"e_cardinality\">");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"</data>");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                    "<data key=\"e_weight\">");
    poVar6 = std::ostream::_M_insert<double>((double)p_Var1);
    poVar6 = std::operator<<(poVar6,"</data>");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                             "</edge>");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  ::~_Rb_tree(&existing_edges._M_t);
  return;
}

Assistant:

virtual void write_clauses(const Cnf& value) override {
            typedef struct {
                unsigned cardinality;
                double weight;
            } edge_data_t;
            
            stream() << std::dec;
            std::map<uint64_t, edge_data_t> existing_edges;
            
            const uint32_t* data = value.data();
            const uint32_t* data_end = data + value.data_size();
            while (data < data_end) {
                // iterate literal pairs
                // it is guaranteed that the sequence is sorted and no duplicates exist
                // weight is calculated such that the sum of weights of edges generated from a clause is 1
                for (auto i = 0; i < _clause_size(data); i++) {
                    if (_clause_size(data) > 1) {
                        uint16_t cardinality = 1;
                        if (_clause_size(data) < 4) {
                            cardinality = get_cardinality_uint16(_clause_flags(data));
                        };
                        
                        const double weight = 2.0 * cardinality / _clause_size(data) / (_clause_size(data) - 1);
                        
                        for (auto j = i + 1; j < _clause_size(data); j++) {
                            const variableid_t source = literal_t__variable_id(_clause_literal(data, i));
                            const variableid_t target = literal_t__variable_id(_clause_literal(data, j));
                            const uint64_t key = ((uint64_t)target << 32) | source;
                            
                            // check if the adge exists already; ignore if so, add otherwise
                            auto it = existing_edges.find(key);
                            if (it == existing_edges.end()) {
                                const edge_data_t edge_data{cardinality, weight};
                                existing_edges.insert({key, edge_data});
                            } else {
                                it->second.cardinality += cardinality;
                                it->second.weight += weight;
                            };
                        };
                    };
                };
                
                data += _clause_memory_size(data);
            };
            
            for (auto edge: existing_edges) {
                const variableid_t source = edge.first & 0xFFFFFFFF;
                const variableid_t target = edge.first >> 32;
                
                stream() << "<edge source=\"v" << literal_t(variable_t(source)) << "\" target=\"v" << literal_t(variable_t(target)) << "\">" << std::endl;
                stream() << "<data key=\"e_cardinality\">" << edge.second.cardinality << "</data>" << std::endl;
                stream() << "<data key=\"e_weight\">" << edge.second.weight << "</data>" << std::endl;
                stream() << "</edge>" << std::endl;
            };
        }